

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int xmlCharEncInFunc(xmlCharEncodingHandler *handler,xmlBufferPtr out,xmlBufferPtr in)

{
  uint uVar1;
  uint uVar2;
  int written;
  int toconv;
  uint local_28;
  uint local_24;
  
  uVar1 = 0xffffffff;
  if (in != (xmlBufferPtr)0x0 &&
      (out != (xmlBufferPtr)0x0 && handler != (xmlCharEncodingHandler *)0x0)) {
    local_24 = in->use;
    if (local_24 == 0) {
      uVar1 = 0;
    }
    else {
      uVar1 = out->use;
      local_28 = ~uVar1 + out->size;
      if ((int)local_28 <= (int)(local_24 * 2)) {
        xmlBufferGrow(out,out->size + local_24 * 2);
        uVar1 = out->use;
        local_28 = ~uVar1 + out->size;
      }
      if (handler->input == (xmlCharEncodingInputFunc)0x0) {
        local_28 = 0;
        local_24 = 0;
        uVar1 = 0xffffffff;
      }
      else {
        uVar1 = (*handler->input)(out->content + uVar1,(int *)&local_28,in->content,(int *)&local_24
                                 );
        uVar1 = (int)uVar1 >> 0x1f & uVar1;
      }
      xmlBufferShrink(in,local_24);
      uVar2 = out->use + local_28;
      out->use = uVar2;
      out->content[uVar2] = '\0';
      if (local_28 != 0) {
        uVar1 = local_28;
      }
    }
  }
  return uVar1;
}

Assistant:

int
xmlCharEncInFunc(xmlCharEncodingHandler * handler, xmlBufferPtr out,
                 xmlBufferPtr in)
{
    int ret;
    int written;
    int toconv;

    if (handler == NULL)
        return(XML_ENC_ERR_INTERNAL);
    if (out == NULL)
        return(XML_ENC_ERR_INTERNAL);
    if (in == NULL)
        return(XML_ENC_ERR_INTERNAL);

    toconv = in->use;
    if (toconv == 0)
        return (0);
    written = out->size - out->use -1; /* count '\0' */
    if (toconv * 2 >= written) {
        xmlBufferGrow(out, out->size + toconv * 2);
        written = out->size - out->use - 1;
    }
    ret = xmlEncInputChunk(handler, &out->content[out->use], &written,
                           in->content, &toconv);
    xmlBufferShrink(in, toconv);
    out->use += written;
    out->content[out->use] = 0;

    return (written? written : ret);
}